

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

void __thiscall
helics::FilterFederate::processFilterInfo(FilterFederate *this,ActionMessage *command)

{
  byte *pbVar1;
  GlobalHandle id;
  GlobalHandle id_00;
  string_view type_in;
  string_view type_in_00;
  string_view type_out;
  string_view type_out_00;
  FilterInfo **filt;
  FilterCoordinator *pFVar2;
  string *psVar3;
  BasicHandleInfo *pBVar4;
  FilterInfo *pFVar5;
  pointer ppFVar6;
  string_view key;
  string_view key_00;
  allocator<char> local_171;
  InterfaceHandle local_170;
  GlobalBrokerId local_16c;
  FilterInfo *newFilter;
  size_t local_148;
  char *pcStack_140;
  size_t local_138;
  char *pcStack_130;
  size_t local_128;
  char *pcStack_120;
  size_t local_118;
  char *pcStack_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ActionMessage err;
  
  pFVar2 = getFilterCoordinator(this,(InterfaceHandle)(command->dest_handle).hid);
  if (pFVar2 != (FilterCoordinator *)0x0) {
    if ((command->flags & 2) == 0) {
      for (ppFVar6 = (pFVar2->allSourceFilters).
                     super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppFVar6 !=
          (pFVar2->allSourceFilters).
          super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppFVar6 = ppFVar6 + 1) {
        if ((((*ppFVar6)->core_id).gid == (command->source_id).gid) &&
           (((*ppFVar6)->handle).hid == (command->source_handle).hid)) {
          return;
        }
      }
      id.fed_id.gid = (command->source_id).gid;
      id.handle.hid = (command->source_handle).hid;
      newFilter = getFilterInfo(this,id);
      if (newFilter == (FilterInfo *)0x0) {
        local_16c.gid = (command->source_id).gid;
        local_170.hid = (command->source_handle).hid;
        local_108._M_dataplus._M_p = (pointer)(command->payload).bufferSize;
        local_108._M_string_length = (size_type)(command->payload).heap;
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&err,(basic_string_view<char,_std::char_traits<char>_> *)&local_108,
                   &local_171);
        key._M_str._4_4_ = err.messageID;
        key._M_str._0_4_ = err.messageAction;
        psVar3 = ActionMessage::getString_abi_cxx11_(command,0);
        pcStack_130 = (psVar3->_M_dataplus)._M_p;
        local_138 = psVar3->_M_string_length;
        psVar3 = ActionMessage::getString_abi_cxx11_(command,1);
        pcStack_140 = (psVar3->_M_dataplus)._M_p;
        local_148 = psVar3->_M_string_length;
        type_in._M_str = pcStack_130;
        type_in._M_len = local_138;
        type_out._M_str = pcStack_140;
        type_out._M_len = local_148;
        key._M_len._0_4_ = err.source_id.gid;
        key._M_len._4_4_ = err.source_handle.hid;
        newFilter = createFilter(this,local_16c,local_170,key,type_in,type_out,
                                 (bool)((byte)(command->flags >> 9) & 1));
        std::__cxx11::string::~string((string *)&err);
      }
      std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::push_back
                (&pFVar2->allSourceFilters,&newFilter);
      pFVar2->hasSourceFilters = true;
      pBVar4 = HandleManager::getInterfaceHandle
                         (this->mHandles,(InterfaceHandle)(command->dest_handle).hid,ENDPOINT);
      if (pBVar4 != (BasicHandleInfo *)0x0) {
        pbVar1 = (byte *)((long)&pBVar4->flags + 1);
        *pbVar1 = *pbVar1 | 8;
      }
    }
    else {
      if ((command->flags >> 9 & 1) == 0) {
        pFVar5 = pFVar2->destFilter;
        if (((pFVar5 != (FilterInfo *)0x0) && ((pFVar5->core_id).gid == (command->source_id).gid))
           && ((pFVar5->handle).hid == (command->source_handle).hid)) {
          return;
        }
      }
      else {
        for (ppFVar6 = (pFVar2->cloningDestFilters).
                       super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppFVar6 !=
            (pFVar2->cloningDestFilters).
            super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppFVar6 = ppFVar6 + 1) {
          if ((((*ppFVar6)->core_id).gid == (command->source_id).gid) &&
             (((*ppFVar6)->handle).hid == (command->source_handle).hid)) {
            return;
          }
        }
      }
      pBVar4 = HandleManager::getInterfaceHandle
                         (this->mHandles,(InterfaceHandle)(command->dest_handle).hid,ENDPOINT);
      if (((pBVar4 == (BasicHandleInfo *)0x0) ||
          (pbVar1 = (byte *)((long)&pBVar4->flags + 1), *pbVar1 = *pbVar1 | 0x20,
          (command->flags & 0x200) != 0)) || (pFVar2->hasDestFilters != true)) {
        id_00.fed_id.gid = (command->source_id).gid;
        id_00.handle.hid = (command->source_handle).hid;
        pFVar5 = getFilterInfo(this,id_00);
        newFilter = pFVar5;
        if (pFVar5 == (FilterInfo *)0x0) {
          local_16c.gid = (command->source_id).gid;
          local_170.hid = (command->source_handle).hid;
          local_108._M_dataplus._M_p = (pointer)(command->payload).bufferSize;
          local_108._M_string_length = (size_type)(command->payload).heap;
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&err,(basic_string_view<char,_std::char_traits<char>_> *)&local_108,
                     &local_171);
          key_00._M_str._4_4_ = err.messageID;
          key_00._M_str._0_4_ = err.messageAction;
          psVar3 = ActionMessage::getString_abi_cxx11_(command,0);
          pcStack_110 = (psVar3->_M_dataplus)._M_p;
          local_118 = psVar3->_M_string_length;
          psVar3 = ActionMessage::getString_abi_cxx11_(command,1);
          pcStack_120 = (psVar3->_M_dataplus)._M_p;
          local_128 = psVar3->_M_string_length;
          type_in_00._M_str = pcStack_110;
          type_in_00._M_len = local_118;
          type_out_00._M_str = pcStack_120;
          type_out_00._M_len = local_128;
          key_00._M_len._0_4_ = err.source_id.gid;
          key_00._M_len._4_4_ = err.source_handle.hid;
          pFVar5 = createFilter(this,local_16c,local_170,key_00,type_in_00,type_out_00,
                                (bool)((byte)(command->flags >> 9) & 1));
          newFilter = pFVar5;
          std::__cxx11::string::~string((string *)&err);
        }
        pFVar2->hasDestFilters = true;
        if ((command->flags & 0x200) == 0) {
          if (pBVar4 != (BasicHandleInfo *)0x0) {
            pbVar1 = (byte *)((long)&pBVar4->flags + 1);
            *pbVar1 = *pbVar1 | 0x40;
          }
          pFVar2->destFilter = pFVar5;
        }
        else {
          std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::push_back
                    (&pFVar2->cloningDestFilters,&newFilter);
        }
      }
      else {
        ActionMessage::ActionMessage(&err,cmd_error);
        err.dest_id.gid = (command->source_id).gid;
        err.source_id.gid = (command->dest_id).gid;
        err.source_handle.hid = (command->dest_handle).hid;
        err.messageID = -1;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &newFilter,"Endpoint ",&pBVar4->key);
        std::operator+(&local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &newFilter," already has a destination filter");
        SmallBuffer::operator=(&err.payload,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&newFilter);
        std::function<void_(helics::ActionMessage_&&)>::operator()(&this->mSendMessageMove,&err);
        ActionMessage::~ActionMessage(&err);
      }
    }
  }
  return;
}

Assistant:

void FilterFederate::processFilterInfo(ActionMessage& command)
{
    auto* filterC = getFilterCoordinator(command.dest_handle);
    if (filterC == nullptr) {
        return;
    }
    bool FilterAlreadyPresent = false;
    if (checkActionFlag(command, destination_target)) {
        if (checkActionFlag(command, clone_flag)) {
            for (auto& filt : filterC->cloningDestFilters) {
                if ((filt->core_id == command.source_id) &&
                    (filt->handle == command.source_handle)) {
                    FilterAlreadyPresent = true;
                    break;
                }
            }
        } else {  // there can only be one non-cloning destination filter
            if (filterC->destFilter != nullptr) {
                if ((filterC->destFilter->core_id == command.source_id) &&
                    (filterC->destFilter->handle == command.source_handle)) {
                    FilterAlreadyPresent = true;
                }
            }
        }

        if (!FilterAlreadyPresent) {
            auto* endhandle =
                mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::ENDPOINT);
            if (endhandle != nullptr) {
                setActionFlag(*endhandle, has_dest_filter_flag);
                if ((!checkActionFlag(command, clone_flag)) && (filterC->hasDestFilters)) {
                    // duplicate non cloning destination filters are not allowed
                    ActionMessage err(CMD_ERROR);
                    err.dest_id = command.source_id;
                    err.setSource(command.getDest());
                    err.messageID = defs::Errors::REGISTRATION_FAILURE;
                    err.payload =
                        "Endpoint " + endhandle->key + " already has a destination filter";
                    mSendMessageMove(std::move(err));
                    return;
                }
            }
            auto* newFilter = getFilterInfo(command.getSource());
            if (newFilter == nullptr) {
                newFilter = createFilter(GlobalBrokerId(command.source_id),
                                         command.source_handle,
                                         std::string(command.payload.to_string()),
                                         command.getString(typeStringLoc),
                                         command.getString(typeOutStringLoc),
                                         checkActionFlag(command, clone_flag));
            }

            filterC->hasDestFilters = true;
            if (checkActionFlag(command, clone_flag)) {
                filterC->cloningDestFilters.push_back(newFilter);
            } else {
                if (endhandle != nullptr) {
                    setActionFlag(*endhandle, has_non_cloning_dest_filter_flag);
                }
                filterC->destFilter = newFilter;
            }
        }
    } else {
        for (auto& filt : filterC->allSourceFilters) {
            if ((filt->core_id == command.source_id) && (filt->handle == command.source_handle)) {
                FilterAlreadyPresent = true;
                break;
            }
        }
        if (!FilterAlreadyPresent) {
            auto* newFilter = getFilterInfo(command.getSource());
            if (newFilter == nullptr) {
                newFilter = createFilter(GlobalBrokerId(command.source_id),
                                         command.source_handle,
                                         std::string(command.payload.to_string()),
                                         command.getString(typeStringLoc),
                                         command.getString(typeOutStringLoc),
                                         checkActionFlag(command, clone_flag));
            }
            filterC->allSourceFilters.push_back(newFilter);
            filterC->hasSourceFilters = true;
            auto* endhandle =
                mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::ENDPOINT);
            if (endhandle != nullptr) {
                setActionFlag(*endhandle, has_source_filter_flag);
            }
        }
    }
}